

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomvar.hpp
# Opt level: O1

double __thiscall MetaSim::ParetoVar::getMinimum(ParetoVar *this)

{
  MaxException *this_00;
  string local_48;
  
  this_00 = (MaxException *)__cxa_allocate_exception(0x30);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"ExponentialVar","");
  RandomVar::MaxException::MaxException(this_00,&local_48);
  __cxa_throw(this_00,&RandomVar::MaxException::typeinfo,BaseExc::~BaseExc);
}

Assistant:

virtual double getMinimum() throw(MaxException)
            {throw MaxException("ExponentialVar");}